

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::BrReg2
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,RegSlot R1,RegSlot R2)

{
  code *pcVar1;
  bool bVar2;
  RegSlot R1_00;
  RegSlot R2_00;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x16);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x366,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0088f0c2;
    *puVar3 = 0;
  }
  CheckLabel(this,labelID);
  if (R1 != 0xffffffff) {
    pFVar4 = this->m_functionWrite;
    if (pFVar4 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0088f0c2;
      *puVar3 = 0;
      pFVar4 = this->m_functionWrite;
    }
    R1_00 = FunctionBody::MapRegSlot(pFVar4,R1);
    if (R2 != 0xffffffff) {
      pFVar4 = this->m_functionWrite;
      if (pFVar4 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar2) goto LAB_0088f0c2;
        *puVar3 = 0;
        pFVar4 = this->m_functionWrite;
      }
      R2_00 = FunctionBody::MapRegSlot(pFVar4,R2);
      bVar2 = TryWriteBrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,labelID,R1_00,R2_00);
      if (bVar2) {
        return;
      }
      bVar2 = TryWriteBrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,labelID,R1_00,R2_00);
      if (bVar2) {
        return;
      }
      bVar2 = TryWriteBrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>(this,op,labelID,R1_00,R2_00);
      if (bVar2) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x36c,"(success)","success");
      if (bVar2) {
        *puVar3 = 0;
        return;
      }
      goto LAB_0088f0c2;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_0088f0c2:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::BrReg2(OpCode op, ByteCodeLabel labelID, RegSlot R1, RegSlot R2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::BrReg2);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        CheckLabel(labelID);

        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);

        MULTISIZE_LAYOUT_WRITE(BrReg2, op, labelID, R1, R2);
    }